

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

string * __thiscall
LinearSystem::SwapMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,SwapMatrix *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  ostringstream local_1a8 [6];
  bool is_column_writed;
  bool started;
  ostringstream out;
  allocator<char> local_19;
  SwapMatrix *local_18;
  SwapMatrix *this_local;
  
  local_18 = this;
  this_local = (SwapMatrix *)__return_storage_ptr__;
  bVar2 = IsEmpty(this);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = std::operator<<((ostream *)local_1a8,"\\begin{bmatrix}");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar2 = this->first_row_ != this->second_row_;
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)local_1a8,"row: \\\\");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->first_row_);
      poVar3 = std::operator<<(poVar3," \\leftrightarrows ");
      std::ostream::operator<<(poVar3,this->second_row_);
    }
    bVar1 = false;
    if (this->first_main_column_ != this->second_main_column_) {
      if (bVar2) {
        poVar3 = std::operator<<((ostream *)local_1a8," \\\\");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = std::operator<<((ostream *)local_1a8,"col: \\\\");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      bVar1 = true;
      bVar2 = true;
      poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->first_main_column_);
      poVar3 = std::operator<<(poVar3," \\leftrightarrows ");
      std::ostream::operator<<(poVar3,this->second_main_column_);
    }
    if (this->first_extension_column_ != this->second_extension_column_) {
      if (bVar2) {
        poVar3 = std::operator<<((ostream *)local_1a8," \\\\");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)local_1a8,"col: \\\\");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->first_extension_column_);
      poVar3 = std::operator<<(poVar3," \\leftrightarrows ");
      std::ostream::operator<<(poVar3,this->second_extension_column_);
    }
    std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)local_1a8,"\\end{bmatrix}");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinearSystem::SwapMatrix::ToLaTex() const {
  if (IsEmpty()) {
    return "";
  }
  std::ostringstream out;
  bool started = false;
  out << "\\begin{bmatrix}" << std::endl;
  if (first_row_ != second_row_) {
    started = true;
    out << "row: \\\\" << std::endl;
    out << first_row_  << " \\leftrightarrows " << second_row_;
  }
  bool is_column_writed = false;
  if (first_main_column_ != second_main_column_) {
    if (started) {
      out << " \\\\" << std::endl;
    }
    out << "col: \\\\" << std::endl;
    is_column_writed = true;
    started = true;
    out << first_main_column_ << " \\leftrightarrows " << second_main_column_;
  }
  if (first_extension_column_ != second_extension_column_) {
    if (started) {
      out << " \\\\" << std::endl;
    }
    if (!is_column_writed) {
        out << "col: \\\\" << std::endl;
    }
    out << first_extension_column_ << " \\leftrightarrows " << second_extension_column_;
  }
  out << std::endl;
  out << "\\end{bmatrix}";

  return out.str();
}